

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5PorterGobbleVC(char *zStem,int nStem,int bPrevCons)

{
  int iVar1;
  int iVar2;
  uint local_28;
  int local_24;
  int bCons;
  int i;
  int bPrevCons_local;
  int nStem_local;
  char *zStem_local;
  
  local_28 = bPrevCons;
  for (local_24 = 0; local_24 < nStem; local_24 = local_24 + 1) {
    iVar1 = fts5PorterIsVowel(zStem[local_24],local_28);
    local_28 = (iVar1 != 0 ^ 0xff) & 1;
    if (local_28 == 0) break;
  }
  do {
    iVar1 = local_24;
    local_24 = iVar1 + 1;
    if (nStem <= local_24) {
      return 0;
    }
    iVar2 = fts5PorterIsVowel(zStem[local_24],local_28);
    local_28 = (uint)(iVar2 == 0);
  } while (iVar2 != 0);
  return iVar1 + 2;
}

Assistant:

static int fts5PorterGobbleVC(char *zStem, int nStem, int bPrevCons){
  int i;
  int bCons = bPrevCons;

  /* Scan for a vowel */
  for(i=0; i<nStem; i++){
    if( 0==(bCons = !fts5PorterIsVowel(zStem[i], bCons)) ) break;
  }

  /* Scan for a consonent */
  for(i++; i<nStem; i++){
    if( (bCons = !fts5PorterIsVowel(zStem[i], bCons)) ) return i+1;
  }
  return 0;
}